

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void preinit_thread(lua_State *L,global_State *g)

{
  global_State *g_local;
  lua_State *L_local;
  
  L->l_G = g;
  (L->stack).p = (StkId)0x0;
  L->ci = (CallInfo *)0x0;
  L->nci = 0;
  L->twups = L;
  L->nCcalls = 0;
  L->errorJmp = (lua_longjmp *)0x0;
  L->hook = (lua_Hook)0x0;
  L->hookmask = 0;
  L->basehookcount = 0;
  L->allowhook = '\x01';
  L->hookcount = L->basehookcount;
  L->openupval = (UpVal *)0x0;
  L->status = '\0';
  L->errfunc = 0;
  L->oldpc = 0;
  (L->base_ci).next = (CallInfo *)0x0;
  (L->base_ci).previous = (CallInfo *)0x0;
  return;
}

Assistant:

static void preinit_thread (lua_State *L, global_State *g) {
  G(L) = g;
  L->stack.p = NULL;
  L->ci = NULL;
  L->nci = 0;
  L->twups = L;  /* thread has no upvalues */
  L->nCcalls = 0;
  L->errorJmp = NULL;
  L->hook = NULL;
  L->hookmask = 0;
  L->basehookcount = 0;
  L->allowhook = 1;
  resethookcount(L);
  L->openupval = NULL;
  L->status = LUA_OK;
  L->errfunc = 0;
  L->oldpc = 0;
  L->base_ci.previous = L->base_ci.next = NULL;
}